

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O1

TimeProcessingResult __thiscall
helics::ForwardingTimeCoordinator::processTimeMessage
          (ForwardingTimeCoordinator *this,ActionMessage *cmd)

{
  TimeProcessingResult TVar1;
  int iVar2;
  
  TVar1 = BaseTimeCoordinator::processTimeMessage(&this->super_BaseTimeCoordinator,cmd);
  if (TVar1 == PROCESSED_NEW_REQUEST) {
    iVar2 = 100;
    if (this->sequenceModifier < 0x3e1d) {
      iVar2 = this->sequenceModifier + 100;
    }
    this->sequenceModifier = iVar2;
    (this->super_BaseTimeCoordinator).sequenceCounter =
         iVar2 + (this->upstream).super_TimeData.sequenceCounter;
  }
  return TVar1;
}

Assistant:

TimeProcessingResult ForwardingTimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    auto res = BaseTimeCoordinator::processTimeMessage(cmd);
    if (res == TimeProcessingResult::PROCESSED_NEW_REQUEST) {
        sequenceModifier += mSequenceIncrement;
        if (sequenceModifier > 16000) {
            sequenceModifier = mSequenceIncrement;
        }
        sequenceCounter = upstream.sequenceCounter + sequenceModifier;
    }
    return res;
}